

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O2

set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_> * __thiscall
GLRParser::findParseOptions
          (set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
           *__return_storage_ptr__,GLRParser *this,string *inputChar,GLRState *currentState)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pcVar2;
  __type _Var3;
  ParseOperation *this_00;
  Production *this_01;
  _Base_ptr p_Var4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_9a;
  allocator<char> local_99;
  _Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ParseOperation *local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = (_Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
              *)__return_storage_ptr__;
  startStateName_abi_cxx11_();
  _Var3 = std::operator==(&currentState->name,&local_90);
  if (_Var3) {
    _Var3 = std::operator==(inputChar,&this->startState->name);
    std::__cxx11::string::~string((string *)&local_90);
    if (!_Var3) goto LAB_001195cf;
    this_00 = (ParseOperation *)operator_new(0x18);
    this_01 = (Production *)operator_new(0x38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"accept",&local_99);
    startStateName_abi_cxx11_();
    __l._M_len = 1;
    __l._M_array = &local_58;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_70,__l,&local_9a);
    Production::Production(this_01,&local_90,&local_70);
    ParseOperation::ParseOperation(this_00,this_01);
    local_38 = this_00;
    std::
    _Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
    ::_M_insert_unique<ParseOperation*>(local_98,&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_70);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&local_90);
LAB_001195cf:
  for (p_Var4 = (currentState->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(currentState->statesTo)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(p_Var4 + 1);
    _Var3 = std::operator==(__lhs,inputChar);
    if (_Var3) {
      local_90._M_dataplus._M_p = (pointer)operator_new(0x18);
      pcVar2 = __lhs[1]._M_dataplus._M_p;
      local_90._M_dataplus._M_p[8] = '\0';
      local_90._M_dataplus._M_p[9] = '\0';
      local_90._M_dataplus._M_p[10] = '\0';
      local_90._M_dataplus._M_p[0xb] = '\0';
      local_90._M_dataplus._M_p[0xc] = '\0';
      local_90._M_dataplus._M_p[0xd] = '\0';
      local_90._M_dataplus._M_p[0xe] = '\0';
      local_90._M_dataplus._M_p[0xf] = '\0';
      *(pointer *)(local_90._M_dataplus._M_p + 0x10) = pcVar2;
      local_90._M_dataplus._M_p[0] = '\x01';
      local_90._M_dataplus._M_p[1] = '\0';
      local_90._M_dataplus._M_p[2] = '\0';
      local_90._M_dataplus._M_p[3] = '\0';
      std::
      _Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
      ::_M_insert_unique<ParseOperation*>(local_98,(ParseOperation **)&local_90);
    }
  }
  return (set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_> *)
         local_98;
}

Assistant:

set<ParseOperation *>
GLRParser::findParseOptions(const std::string &inputChar, const GLRState *currentState) const {

    set<ParseOperation *> parseOperations;

    if (currentState->getName() == startStateName() && inputChar == startState->getName()) {
        parseOperations.insert(new ParseOperation(new Production("accept", {startStateName()})));
    }

    for (auto stateTo: currentState->getStatesTo()) {
        if (stateTo->getLabel() == inputChar) {
            parseOperations.insert(new ParseOperation(stateTo->getStateTo()));

//            if (stateTo->getStateTo()->isAccepting()) {
//                for (auto prod: stateTo->getStateTo()->getProductions()) {
//                    if (prod->getToP()[prod->getToP().size() - 1] == getMarker()) {
//                        parseOperations.insert(new ParseOperation(prod));
//                    }
//                }
//            }

        }
    }
    return parseOperations;
}